

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::Response<capnp::AnyPointer>_>::~ExceptionOr
          (ExceptionOr<capnp::Response<capnp::AnyPointer>_> *this)

{
  ExceptionOr<capnp::Response<capnp::AnyPointer>_> *this_local;
  
  Maybe<capnp::Response<capnp::AnyPointer>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;